

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O0

void printBits(char *c,float f)

{
  char local_19;
  int j;
  int i;
  uif x;
  float f_local;
  char *c_local;
  
  j = 0;
  for (i = 0x1f; -1 < i; i = i + -1) {
    local_19 = '1';
    if (((uint)f >> ((byte)i & 0x1f) & 1) == 0) {
      local_19 = '0';
    }
    c[j] = local_19;
    if ((i == 0x1f) || (i == 0x17)) {
      j = j + 1;
      c[j] = ' ';
    }
    j = j + 1;
  }
  c[0x22] = '\0';
  return;
}

Assistant:

IMATH_EXPORT void
printBits (char c[35], float f)
{
    half::uif x;
    x.f = f;

    for (int i = 31, j = 0; i >= 0; i--, j++)
    {
        c[j] = (((x.i >> i) & 1) ? '1' : '0');

        if (i == 31 || i == 23)
            c[++j] = ' ';
    }

    c[34] = 0;
}